

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::scalarString(Output *this,StringRef *S,QuotingType MustQuote)

{
  char *pcVar1;
  StringRef Str;
  uint uVar2;
  size_t sVar3;
  undefined1 in_R8B;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  StringRef Input;
  StringRef Str_00;
  StringRef s;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef s_00;
  string local_58;
  char *local_38;
  
  newLineCheck(this);
  sVar3 = S->Length;
  if (sVar3 == 0) {
    pcVar4 = "\'\'";
    sVar3 = 2;
  }
  else if (MustQuote == None) {
    pcVar4 = S->Data;
  }
  else {
    pcVar4 = "\"";
    if (MustQuote == Single) {
      pcVar4 = "\'";
    }
    this->Column = this->Column + 1;
    Str_00.Length = 1;
    Str_00.Data = pcVar4;
    raw_ostream::operator<<(this->Out,Str_00);
    if (MustQuote == Double) {
      Input.Length = 0;
      Input.Data = (char *)S->Length;
      escape_abi_cxx11_(&local_58,(yaml *)S->Data,Input,(bool)in_R8B);
      Str.Length = local_58._M_string_length;
      Str.Data = local_58._M_dataplus._M_p;
      this->Column = this->Column + (int)local_58._M_string_length;
      raw_ostream::operator<<(this->Out,Str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      s.Length = 1;
      s.Data = pcVar4;
      outputUpToEndOfLine(this,s);
      return;
    }
    pcVar1 = S->Data;
    uVar7 = 0;
    uVar2 = 0;
    iVar6 = (int)S->Length;
    local_38 = pcVar4;
    if (iVar6 != 0) {
      do {
        if (S->Length <= uVar7) {
          __assert_fail("Index < Length && \"Invalid index!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0xf9,"char llvm::StringRef::operator[](size_t) const");
        }
        if (S->Data[uVar7] == '\'') {
          Str_01.Data = pcVar1 + uVar2;
          iVar5 = (int)uVar7;
          Str_01.Length._0_4_ = iVar5 - uVar2;
          this->Column = (this->Column - uVar2) + iVar5;
          Str_01.Length._4_4_ = 0;
          raw_ostream::operator<<(this->Out,Str_01);
          this->Column = this->Column + 2;
          Str_02.Length = 2;
          Str_02.Data = "\'\'";
          raw_ostream::operator<<(this->Out,Str_02);
          uVar2 = iVar5 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (iVar6 != (int)uVar7);
    }
    iVar6 = (int)uVar7 - uVar2;
    this->Column = this->Column + iVar6;
    Str_03.Length._0_4_ = iVar6;
    Str_03.Data = pcVar1 + uVar2;
    Str_03.Length._4_4_ = 0;
    raw_ostream::operator<<(this->Out,Str_03);
    sVar3 = 1;
    pcVar4 = local_38;
  }
  s_00.Length = sVar3;
  s_00.Data = pcVar4;
  outputUpToEndOfLine(this,s_00);
  return;
}

Assistant:

void Output::scalarString(StringRef &S, QuotingType MustQuote) {
  newLineCheck();
  if (S.empty()) {
    // Print '' for the empty string because leaving the field empty is not
    // allowed.
    outputUpToEndOfLine("''");
    return;
  }
  if (MustQuote == QuotingType::None) {
    // Only quote if we must.
    outputUpToEndOfLine(S);
    return;
  }

  const char *const Quote = MustQuote == QuotingType::Single ? "'" : "\"";
  output(Quote); // Starting quote.

  // When using double-quoted strings (and only in that case), non-printable characters may be
  // present, and will be escaped using a variety of unicode-scalar and special short-form
  // escapes. This is handled in yaml::escape.
  if (MustQuote == QuotingType::Double) {
    output(yaml::escape(S, /* EscapePrintable= */ false));
    outputUpToEndOfLine(Quote);
    return;
  }

  unsigned i = 0;
  unsigned j = 0;
  unsigned End = S.size();
  const char *Base = S.data();

  // When using single-quoted strings, any single quote ' must be doubled to be escaped.
  while (j < End) {
    if (S[j] == '\'') {                    // Escape quotes.
      output(StringRef(&Base[i], j - i));  // "flush".
      output(StringLiteral("''"));         // Print it as ''
      i = j + 1;
    }
    ++j;
  }
  output(StringRef(&Base[i], j - i));
  outputUpToEndOfLine(Quote); // Ending quote.
}